

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::DirectStateAccess::VertexArrays::GetVertexArrayIndexedErrorsTest::iterate
          (GetVertexArrayIndexedErrorsTest *this)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ContextType ctxType;
  deUint32 err;
  undefined4 extraout_var;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  int iVar8;
  GLuint vao;
  GLint storage;
  GLint64 storage64;
  int local_38 [2];
  undefined8 local_30;
  long lVar7;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar6);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar1) || (bVar2)) {
    iVar6 = 0;
    local_38[0] = 0;
    local_38[1] = 0;
    local_30 = 0;
    do {
      iVar6 = iVar6 + 1;
      bVar1 = true;
      do {
        bVar2 = bVar1;
        if (!bVar2) break;
        bVar1 = false;
      } while (iVar6 != 0x8622);
    } while (bVar2);
    (**(code **)(lVar7 + 0x410))(1,local_38);
    err = (**(code **)(lVar7 + 0x800))();
    glu::checkError(err,"glCreateVertexArrays call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x157b);
    iVar8 = 0;
    do {
      iVar8 = iVar8 + 1;
      cVar3 = (**(code **)(lVar7 + 0xcd8))(iVar8);
    } while (cVar3 != '\0');
    (**(code **)(lVar7 + 0xb80))(iVar8,0,0x8622,local_38 + 1);
    bVar1 = CheckError(this,0x502,
                       "INVALID_OPERATION error was not generated by GetVertexArrayIndexediv if vaobj is not the name of an existing vertex array object."
                      );
    (**(code **)(lVar7 + 0xb78))(iVar8,0,0x82d7,&local_30);
    bVar2 = CheckError(this,0x502,
                       "INVALID_OPERATION error was not generated by GetVertexArrayIndexed64iv if vaobj is not the name of an existing vertex array object."
                      );
    (**(code **)(lVar7 + 0xb80))(local_38[0],0,iVar6,local_38 + 1);
    bVar4 = CheckError(this,0x500,
                       "INVALID_ENUM error was not generated by GetVertexArrayIndexediv if pname is not one of the valid values."
                      );
    (**(code **)(lVar7 + 0xb78))(local_38[0],0,0x82d8,&local_30);
    bVar5 = CheckError(this,0x500,
                       "INVALID_ENUM error was not generated by GetVertexArrayIndexed64iv if pname is not VERTEX_BINDING_OFFSET."
                      );
    if (local_38[0] != 0) {
      (**(code **)(lVar7 + 0x490))(1);
    }
    do {
      iVar6 = (**(code **)(lVar7 + 0x800))();
    } while (iVar6 != 0);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (((bVar1 && bVar2) && bVar4) && bVar5) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GetVertexArrayIndexedErrorsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Tested Objects. */
	glw::GLuint vao		  = 0;
	glw::GLuint not_a_vao = 0;

	/* Dummy storage. */
	glw::GLint   storage   = 0;
	glw::GLint64 storage64 = 0;

	/* Bad parameter setup. */
	glw::GLenum bad_pname = 0;

	static const glw::GLenum accepted_pnames[] = { GL_VERTEX_ATTRIB_ARRAY_ENABLED,	GL_VERTEX_ATTRIB_ARRAY_SIZE,
												   GL_VERTEX_ATTRIB_ARRAY_STRIDE,	 GL_VERTEX_ATTRIB_ARRAY_TYPE,
												   GL_VERTEX_ATTRIB_ARRAY_NORMALIZED, GL_VERTEX_ATTRIB_ARRAY_INTEGER,
												   GL_VERTEX_ATTRIB_ARRAY_LONG,		  GL_VERTEX_ATTRIB_ARRAY_DIVISOR,
												   GL_VERTEX_ATTRIB_RELATIVE_OFFSET };

	{
		bool is_accepted_pname = true;
		while (is_accepted_pname)
		{
			bad_pname++;
			is_accepted_pname = false;
			for (glw::GLuint i = 0; i < sizeof(accepted_pnames) / sizeof(accepted_pnames); ++i)
			{
				if (accepted_pnames[i] == bad_pname)
				{
					is_accepted_pname = true;
					break;
				}
			}
		}
	}

	try
	{
		/* Prepare valid Objects. */
		gl.createVertexArrays(1, &vao);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateVertexArrays call failed.");

		/* Prepare invalid VAO. */
		while (gl.isVertexArray(++not_a_vao))
			;

		/* Not a VAO. */
		gl.getVertexArrayIndexediv(not_a_vao, 0, GL_VERTEX_ATTRIB_ARRAY_ENABLED, &storage);

		is_ok &=
			CheckError(GL_INVALID_OPERATION, "INVALID_OPERATION error was not generated by GetVertexArrayIndexediv if "
											 "vaobj is not the name of an existing vertex array object.");

		gl.getVertexArrayIndexed64iv(not_a_vao, 0, GL_VERTEX_BINDING_OFFSET, &storage64);

		is_ok &=
			CheckError(GL_INVALID_OPERATION, "INVALID_OPERATION error was not generated by GetVertexArrayIndexed64iv "
											 "if vaobj is not the name of an existing vertex array object.");

		/* Bad parameter. */
		gl.getVertexArrayIndexediv(vao, 0, bad_pname, &storage);

		is_ok &= CheckError(
			GL_INVALID_ENUM,
			"INVALID_ENUM error was not generated by GetVertexArrayIndexediv if pname is not one of the valid values.");

		/* Bad parameter 64. */
		gl.getVertexArrayIndexed64iv(vao, 0, GL_VERTEX_BINDING_OFFSET + 1, &storage64);

		is_ok &= CheckError(
			GL_INVALID_ENUM,
			"INVALID_ENUM error was not generated by GetVertexArrayIndexed64iv if pname is not VERTEX_BINDING_OFFSET.");
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Clean up. */
	if (vao)
	{
		gl.deleteVertexArrays(1, &vao);
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}